

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O0

void ctor_suite::copy_assign_int(void)

{
  bool *pbVar1;
  undefined1 local_43 [2];
  allocator_type local_41;
  undefined1 local_40 [8];
  test_union<int,_bool,_int> other;
  allocator_type local_19;
  undefined1 local_18 [8];
  test_union<int,_bool,_int> data;
  
  std::allocator<char>::allocator();
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  small_union<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18,
                    true,&local_19);
  std::allocator<char>::~allocator(&local_19);
  pbVar1 = trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>
           ::get<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18)
  ;
  other.current._2_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x40,"void ctor_suite::copy_assign_int()",pbVar1,
             (undefined1 *)((long)&other.current + 2));
  std::allocator<char>::allocator();
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  small_union<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_40,
                    false,&local_41);
  std::allocator<char>::~allocator(&local_41);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  operator=((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_40,
            (small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18);
  pbVar1 = trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>
           ::get<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_40)
  ;
  local_43[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("other.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x43,"void ctor_suite::copy_assign_int()",pbVar1,local_43);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_40);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18);
  return;
}

Assistant:

void copy_assign_int()
{
    test_union<int, bool, int> data{true};
    TRIAL_PROTOCOL_TEST_EQUAL(data.get<bool>(), true);
    test_union<int, bool, int> other{false};
    other = data;
    TRIAL_PROTOCOL_TEST_EQUAL(other.get<bool>(), true);
}